

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O1

void av1_highbd_upsample_intra_edge_c(uint16_t *p,int sz,int bd)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  uint16_t in [19];
  uint16_t local_48 [3];
  ushort local_42 [21];
  
  local_48[0] = p[-1];
  local_48[1] = p[-1];
  if (0 < sz) {
    memcpy(local_48 + 2,p,(ulong)(uint)(sz * 2));
  }
  local_48[(long)sz + 2] = p[(long)sz + -1];
  p[-2] = local_48[0];
  if (0 < sz) {
    uVar2 = 0;
    do {
      uVar1 = local_48[uVar2 + 2];
      iVar3 = (int)((((uint)local_48[uVar2 + 1] + (uint)uVar1) * 9 -
                    ((uint)local_48[uVar2 + 3] + (uint)local_48[uVar2])) + 8) >> 4;
      if (bd == 10) {
        if (0x3fe < iVar3) {
          iVar3 = 0x3ff;
        }
      }
      else if (bd == 0xc) {
        if (0xffe < iVar3) {
          iVar3 = 0xfff;
        }
      }
      else if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      p[uVar2 * 2 + -1] = (uint16_t)iVar3;
      p[uVar2 * 2] = uVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)sz != uVar2);
  }
  return;
}

Assistant:

void av1_highbd_upsample_intra_edge_c(uint16_t *p, int sz, int bd) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint16_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = (s + 8) >> 4;
    s = clip_pixel_highbd(s, bd);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}